

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::do_strip(string *__return_storage_ptr__,string *str,int striptype,string *chars)

{
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong local_58;
  
  uVar1 = str->_M_string_length;
  iVar6 = (int)chars->_M_string_length;
  iVar5 = (int)uVar1;
  iVar8 = iVar5;
  if (iVar6 == 0) {
    local_58._0_4_ = 0;
    if (striptype != 1) {
      pcVar2 = (str->_M_dataplus)._M_p;
      uVar13 = 0;
      uVar9 = 0;
      if (0 < iVar5) {
        uVar9 = uVar1 & 0xffffffff;
      }
      while ((local_58 = uVar9, uVar9 != uVar13 &&
             (iVar6 = ::isspace((int)pcVar2[uVar13]), local_58 = uVar13, iVar6 != 0))) {
        uVar13 = uVar13 + 1;
      }
      if (striptype == 0) goto LAB_00106a3d;
    }
    pcVar2 = (str->_M_dataplus)._M_p;
    lVar12 = (long)iVar5;
    iVar6 = iVar5;
    if ((int)local_58 < iVar5) {
      iVar6 = (int)local_58;
    }
    iVar11 = iVar5 + 1;
    do {
      iVar8 = iVar6;
      if (lVar12 <= (int)local_58) break;
      lVar4 = lVar12 + -1;
      lVar12 = lVar12 + -1;
      iVar10 = ::isspace((int)pcVar2[lVar4]);
      iVar11 = iVar11 + -1;
      iVar8 = iVar11;
    } while (iVar10 != 0);
  }
  else {
    pcVar2 = (chars->_M_dataplus)._M_p;
    local_58._0_4_ = 0;
    if (striptype != 1) {
      pcVar3 = (str->_M_dataplus)._M_p;
      uVar13 = 0;
      uVar9 = 0;
      if (0 < iVar5) {
        uVar9 = uVar1 & 0xffffffff;
      }
      while ((local_58 = uVar9, uVar9 != uVar13 &&
             (pvVar7 = memchr(pcVar2,(int)pcVar3[uVar13],(long)iVar6), local_58 = uVar13,
             pvVar7 != (void *)0x0))) {
        uVar13 = uVar13 + 1;
      }
      if (striptype == 0) goto LAB_00106a3d;
    }
    pcVar3 = (str->_M_dataplus)._M_p;
    lVar12 = (long)iVar5;
    iVar11 = iVar5;
    if ((int)local_58 < iVar5) {
      iVar11 = (int)local_58;
    }
    iVar10 = iVar5 + 1;
    do {
      iVar8 = iVar11;
      if (lVar12 <= (int)local_58) break;
      lVar4 = lVar12 + -1;
      lVar12 = lVar12 + -1;
      pvVar7 = memchr(pcVar2,(int)pcVar3[lVar4],(long)iVar6);
      iVar10 = iVar10 + -1;
      iVar8 = iVar10;
    } while (pvVar7 != (void *)0x0);
  }
LAB_00106a3d:
  if ((iVar8 == iVar5) && ((int)local_58 == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string do_strip( const std::string & str, int striptype, const std::string & chars  )
    {
        Py_ssize_t len = (Py_ssize_t) str.size(), i, j, charslen = (Py_ssize_t) chars.size();

        if ( charslen == 0 )
        {
            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && ::isspace( str[i] ) )
                {
                    i++;
                }
            }

            j = len;
            if ( striptype != LEFTSTRIP )
            {
                do
                {
                    j--;
                }
                while (j >= i && ::isspace(str[j]));

                j++;
            }


        }
        else
        {
            const char * sep = chars.c_str();

            i = 0;
            if ( striptype != RIGHTSTRIP )
            {
                while ( i < len && memchr(sep, str[i], charslen) )
                {
                    i++;
                }
            }

            j = len;
            if (striptype != LEFTSTRIP)
            {
                do
                {
                    j--;
                }
                while (j >= i &&  memchr(sep, str[j], charslen)  );
                j++;
            }


        }

        if ( i == 0 && j == len )
        {
            return str;
        }
        else
        {
            return str.substr( i, j - i );
        }

    }